

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O2

void __thiscall
libcellml::HistoryEpoch::setDestinationModel
          (HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  bool bVar1;
  ImportedEntity local_30;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  bVar1 = ImportedEntity::isImport
                    ((importedEntity->
                     super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (bVar1) {
    ImportedEntity::importSource(&local_30);
    ImportSource::model((ImportSource *)&local_20);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30.mPimpl);
  }
  return;
}

Assistant:

void HistoryEpoch::setDestinationModel(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mDestinationModel = importedEntity->importSource()->model();
    }
}